

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O2

void leveldb::_Test_UseExceedsCacheSize::_RunIt(void)

{
  _Test_UseExceedsCacheSize t;
  CacheTest local_40;
  
  CacheTest::CacheTest(&local_40);
  _Run((_Test_UseExceedsCacheSize *)&local_40);
  CacheTest::~CacheTest(&local_40);
  return;
}

Assistant:

TEST(CacheTest, UseExceedsCacheSize) {
  // Overfill the cache, keeping handles on all inserted entries.
  std::vector<Cache::Handle*> h;
  for (int i = 0; i < kCacheSize + 100; i++) {
    h.push_back(InsertAndReturnHandle(1000 + i, 2000 + i));
  }

  // Check that all the entries can be found in the cache.
  for (int i = 0; i < h.size(); i++) {
    ASSERT_EQ(2000 + i, Lookup(1000 + i));
  }

  for (int i = 0; i < h.size(); i++) {
    cache_->Release(h[i]);
  }
}